

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# frobtadsappcurses.h
# Opt level: O2

void __thiscall
FrobTadsApplicationCurses::print
          (FrobTadsApplicationCurses *this,int line,int column,int attrs,char *str)

{
  int i;
  long lVar1;
  
  for (lVar1 = 0; str[lVar1] != 0; lVar1 = lVar1 + 1) {
    (this->fDispBuf)._M_t.super___uniq_ptr_impl<unsigned_int,_std::default_delete<unsigned_int[]>_>.
    _M_t.super__Tuple_impl<0UL,_unsigned_int_*,_std::default_delete<unsigned_int[]>_>.
    super__Head_base<0UL,_unsigned_int_*,_false>._M_head_impl[lVar1] =
         (uint)(byte)str[lVar1] | attrs;
  }
  (this->fDispBuf)._M_t.super___uniq_ptr_impl<unsigned_int,_std::default_delete<unsigned_int[]>_>.
  _M_t.super__Tuple_impl<0UL,_unsigned_int_*,_std::default_delete<unsigned_int[]>_>.
  super__Head_base<0UL,_unsigned_int_*,_false>._M_head_impl[lVar1] = 0;
  FrobTadsWindow::printStr
            ((this->fGameWindow)._M_t.
             super___uniq_ptr_impl<FrobTadsWindow,_std::default_delete<FrobTadsWindow>_>._M_t.
             super__Tuple_impl<0UL,_FrobTadsWindow_*,_std::default_delete<FrobTadsWindow>_>.
             super__Head_base<0UL,_FrobTadsWindow_*,_false>._M_head_impl,line,column,
             (this->fDispBuf)._M_t.
             super___uniq_ptr_impl<unsigned_int,_std::default_delete<unsigned_int[]>_>._M_t.
             super__Tuple_impl<0UL,_unsigned_int_*,_std::default_delete<unsigned_int[]>_>.
             super__Head_base<0UL,_unsigned_int_*,_false>._M_head_impl);
  return;
}

Assistant:

virtual void
    print( int line, int column, int attrs, const char* str )
    {
        int i;
        for (i = 0; str[i] != '\0'; ++i)
            this->fDispBuf[i] = static_cast<unsigned char>(str[i]) | attrs;
        this->fDispBuf[i] = '\0';
        this->fGameWindow->printStr(line, column, this->fDispBuf.get());
    }